

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestViewClasses::verifyResultData
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          ,uchar *texture_data_ptr,uchar *view_data_ptr)

{
  ostringstream *this_00;
  uint uVar1;
  qpTestLog *pqVar2;
  bool bVar3;
  uint n_component;
  int iVar4;
  uint n_components;
  _format _Var5;
  _format format;
  uint uVar6;
  deUint32 dVar7;
  _sampler_type _Var8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  ostream *poVar16;
  TestError *this_01;
  sbyte sVar17;
  GLuint *pGVar18;
  long lVar19;
  undefined8 uVar20;
  uchar **ppuVar21;
  uint *data;
  uint n;
  ulong uVar22;
  TextureViewTestViewClasses *this_02;
  uint *result;
  TextureViewTestViewClasses *pTVar23;
  uchar *puVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  uint reference_components_uint [4];
  uint view_components_uint [4];
  int view_components_int [4];
  float view_components_float [4];
  int reference_components_int [4];
  stringstream mipmap_data_sstream;
  undefined6 uStack_4be;
  undefined4 uStack_4bc;
  ostringstream local_4b8 [8];
  ostream local_4b0;
  undefined1 local_338 [8];
  Float<unsigned_int,_8,_23,_127,_3U> FStack_330;
  float fStack_32c;
  uint view_component_sizes [4];
  ostream local_1a8;
  undefined4 extraout_var;
  
  pcVar10 = TextureViewUtilities::getInternalformatString(texture_internalformat);
  pcVar11 = TextureViewUtilities::getInternalformatString(view_internalformat);
  iVar4 = bcmp(texture_data_ptr,view_data_ptr,(ulong)this->m_view_data_offset);
  if (iVar4 != 0) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var,iVar4);
    bVar3 = TextureViewUtilities::isInternalformatCompressed(view_internalformat);
    n_components = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat)
    ;
    _Var5 = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);
    view_component_sizes[0] = 0;
    view_component_sizes[1] = 0;
    view_component_sizes[2] = 0;
    view_component_sizes[3] = 0;
    format = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);
    uVar22 = (ulong)n_components;
    if (bVar3) {
      uVar13 = 0;
      if ((texture_internalformat & 0xfffffffe) == 0x8e8e) {
        sVar17 = 5;
        for (; uVar22 != uVar13; uVar13 = uVar13 + 1) {
          view_component_sizes[uVar13] = 0x20;
        }
      }
      else {
        sVar17 = 3;
        for (; uVar22 != uVar13; uVar13 = uVar13 + 1) {
          view_component_sizes[uVar13] = 8;
        }
      }
      uVar6 = n_components << sVar17;
      ppuVar21 = &this->m_decompressed_mipmap_data;
      if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
        operator_delete__(this->m_decompressed_mipmap_data);
        *ppuVar21 = (uchar *)0x0;
      }
      puVar14 = (uchar *)operator_new__((ulong)((uVar6 >> 3) * this->m_texture_width *
                                               this->m_texture_height));
      this->m_decompressed_mipmap_data = puVar14;
      pGVar18 = &this->m_to_id;
      if ((texture_internalformat & 0xfffffffe) == 0x8e8e) {
        pGVar18 = &this->m_view_to_id;
      }
      (**(code **)(lVar12 + 0xb8))(0xde1,*pGVar18);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d93);
      if (n_components == 3) {
        uVar20 = 0x1907;
      }
      else {
        uVar20 = 0x1908;
        if ((n_components != 4) && (uVar20 = 0x1903, n_components == 2)) {
          uVar20 = 0x8227;
        }
      }
      lVar19 = 0x1400;
      if (_Var5 != FORMAT_SNORM) {
        lVar19 = (ulong)(_Var5 == FORMAT_FLOAT) * 5 + 0x1401;
      }
      (**(code **)(lVar12 + 0xaa0))(0xde1,0,uVar20,lVar19,*ppuVar21);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d9e);
    }
    else {
      TextureViewUtilities::getComponentSizeForInternalformat
                (view_internalformat,view_component_sizes);
      uVar6 = view_component_sizes[3] + view_component_sizes[1] +
              view_component_sizes[2] + view_component_sizes[0];
      ppuVar21 = &this->m_mipmap_data;
    }
    puVar14 = *ppuVar21;
    this_02 = (TextureViewTestViewClasses *)(ulong)(n_components << 2);
    bVar25 = true;
    uVar13 = 0;
    bVar3 = false;
    puVar24 = view_data_ptr;
    while ((uVar13 < this->m_texture_width * this->m_texture_height && (bVar25))) {
      data = (uint *)(puVar14 + (uVar6 >> 3) * (int)uVar13);
      _local_338 = (undefined1  [16])0x0;
      reference_components_int[0] = 0;
      reference_components_int[1] = 0;
      reference_components_int[2] = 0;
      reference_components_int[3] = 0;
      reference_components_uint[0] = 0;
      reference_components_uint[1] = 0;
      reference_components_uint[2] = 0;
      reference_components_uint[3] = 0;
      view_components_float[0] = 0.0;
      view_components_float[1] = 0.0;
      view_components_float[2] = 0.0;
      view_components_float[3] = 0.0;
      view_components_int[0] = 0;
      view_components_int[1] = 0;
      view_components_int[2] = 0;
      view_components_int[3] = 0;
      view_components_uint[0] = 0;
      view_components_uint[1] = 0;
      view_components_uint[2] = 0;
      view_components_uint[3] = 0;
      _Var8 = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
      for (uVar15 = 0; uVar22 != uVar15; uVar15 = uVar15 + 1) {
        if (_Var8 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
          view_components_uint[uVar15] = *(uint *)(puVar24 + uVar15 * 4);
        }
        else if (_Var8 == SAMPLER_TYPE_SIGNED_INTEGER) {
          view_components_int[uVar15] = *(int *)(puVar24 + uVar15 * 4);
        }
        else {
          view_components_float[uVar15] = *(float *)(puVar24 + uVar15 * 4);
        }
      }
      if (view_internalformat == 0x8059) {
        if (_Var8 != SAMPLER_TYPE_FLOAT) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e15);
LAB_00ab5135:
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar1 = *data;
        auVar28._0_4_ = (float)(uVar1 & 0x3ff);
        auVar28._4_4_ = (float)(uVar1 >> 10 & 0x3ff);
        auVar28._8_4_ = (float)(uVar1 >> 0x14 & 0x3ff);
        auVar28._12_4_ = (float)(uVar1 >> 0x1e);
        _local_338 = divps(auVar28,_DAT_016f3590);
      }
      else if (view_internalformat == 0x822f) {
        if (_Var8 != SAMPLER_TYPE_FLOAT) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e35);
          goto LAB_00ab5135;
        }
        _mipmap_data_sstream = (short)*data;
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&mipmap_data_sstream);
        local_338._0_4_ = FVar9.m_value;
        _mipmap_data_sstream = (TestLog *)CONCAT62(uStack_4be,*(undefined2 *)((long)data + 2));
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&mipmap_data_sstream);
        local_338._4_4_ = FVar9.m_value;
      }
      else if (view_internalformat == 0x8c3a) {
        if (_Var8 != SAMPLER_TYPE_FLOAT) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1dec);
          goto LAB_00ab5135;
        }
        uVar1 = *data;
        _mipmap_data_sstream = (TestLog *)(CONCAT44(uStack_4bc,uVar1) & 0xffffffff000007ff);
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                          ((Float<unsigned_int,_5,_6,_15,_0U> *)&mipmap_data_sstream);
        local_338._0_4_ = FVar9.m_value;
        _mipmap_data_sstream = (TestLog *)(CONCAT44(uStack_4bc,uVar1 >> 0xb) & 0xffffffff000007ff);
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,0u>
                          ((Float<unsigned_int,_5,_6,_15,_0U> *)&mipmap_data_sstream);
        local_338._4_4_ = FVar9.m_value;
        _mipmap_data_sstream = (TestLog *)CONCAT44(uStack_4bc,uVar1 >> 0x16);
        FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,0u>
                          ((Float<unsigned_int,_5,_5,_15,_0U> *)&mipmap_data_sstream);
        FStack_330.m_value = FVar9.m_value;
      }
      else if (view_internalformat == 0x8c3d) {
        uVar1 = *data;
        fVar26 = ldexpf(1.0,(uVar1 >> 0x1b) - 0x18);
        auVar28 = _local_338;
        if (_Var8 != SAMPLER_TYPE_FLOAT) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e03);
          goto LAB_00ab5135;
        }
        local_338._4_4_ = (float)(uVar1 >> 9 & 0x1ff) * fVar26;
        local_338._0_4_ = (float)(uVar1 & 0x1ff) * fVar26;
        fStack_32c = auVar28._12_4_;
        FStack_330.m_value = (StorageType)((float)(uVar1 >> 0x12 & 0x1ff) * fVar26);
      }
      else if (view_internalformat == 0x906f) {
        if (_Var8 != SAMPLER_TYPE_UNSIGNED_INTEGER) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e27);
          goto LAB_00ab5135;
        }
        uVar1 = *data;
        reference_components_uint._0_8_ = CONCAT44(uVar1 >> 10,uVar1) & 0x3ff000003ff;
        reference_components_uint[2] = uVar1 >> 0x14 & 0x3ff;
        reference_components_uint[3] = uVar1 >> 0x1e;
      }
      else {
        result = (uint *)local_338;
        if (_Var8 != SAMPLER_TYPE_FLOAT) {
          if (_Var8 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
            result = reference_components_uint;
          }
          else {
            result = (uint *)reference_components_int;
          }
        }
        getComponentDataForByteAlignedInternalformat
                  (this_02,(uchar *)data,n_components,view_component_sizes,format,result);
      }
      pTVar23 = (TextureViewTestViewClasses *)0x0;
      do {
        bVar25 = this_02 == pTVar23;
        if (bVar25) goto LAB_00ab4c73;
        if ((((view_internalformat == 0x8c41) || (view_internalformat == 0x8e8d)) ||
            (view_internalformat == 0x8c43)) &&
           (((pTVar23 != (TextureViewTestViewClasses *)0xc && (texture_internalformat != 0x8c41)) &&
            ((texture_internalformat != 0x8c43 && (texture_internalformat != 0x8e8d)))))) {
          fVar26 = *(float *)(local_338 + (long)&(pTVar23->super_TestCase).super_TestCase);
          if (fVar26 <= 0.04045) {
            fVar26 = fVar26 / 12.92;
          }
          else {
            fVar26 = powf((fVar26 + 0.055) / 1.055,2.4);
          }
          *(float *)(local_338 + (long)&(pTVar23->super_TestCase).super_TestCase) = fVar26;
        }
        if (_Var8 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
          lVar19 = (ulong)*(uint *)((long)reference_components_uint + (long)pTVar23) -
                   (ulong)*(uint *)((long)view_components_uint + (long)pTVar23);
          lVar12 = -lVar19;
          if (0 < lVar19) {
            lVar12 = lVar19;
          }
          if (1 < (uint)lVar12) {
            bVar3 = true;
          }
        }
        else if (_Var8 == SAMPLER_TYPE_SIGNED_INTEGER) {
          lVar19 = (long)*(int *)((long)reference_components_int + (long)pTVar23) -
                   (long)*(int *)((long)view_components_int + (long)pTVar23);
          lVar12 = -lVar19;
          if (0 < lVar19) {
            lVar12 = lVar19;
          }
          if (1 < (int)lVar12) {
            bVar3 = true;
          }
        }
        else {
          fVar27 = *(float *)(local_338 + (long)&(pTVar23->super_TestCase).super_TestCase) -
                   *(float *)((long)view_components_float + (long)pTVar23);
          fVar26 = -fVar27;
          if (-fVar27 <= fVar27) {
            fVar26 = fVar27;
          }
          if (1.0 / (float)~(-1 << (*(char *)((long)view_component_sizes + (long)pTVar23) - 1U &
                                   0x1f)) < fVar26) {
            bVar3 = true;
            goto LAB_00ab48e7;
          }
        }
        pTVar23 = (TextureViewTestViewClasses *)
                  ((long)&(pTVar23->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4
                  );
      } while (!bVar3);
      if (_Var8 == SAMPLER_TYPE_UNSIGNED_INTEGER) {
        _mipmap_data_sstream =
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_4b8);
        std::operator<<((ostream *)local_4b8,
                        "Invalid data sampled from an unsigned integer texture view [");
        std::operator<<((ostream *)local_4b8,pcVar11);
        std::operator<<((ostream *)local_4b8,"] created from a texture object[");
        std::operator<<((ostream *)local_4b8,pcVar10);
        std::operator<<((ostream *)local_4b8,"] at texel (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,"): expected:(");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,") found:(");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&mipmap_data_sstream,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else if (_Var8 == SAMPLER_TYPE_SIGNED_INTEGER) {
        _mipmap_data_sstream =
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_4b8);
        std::operator<<((ostream *)local_4b8,
                        "Invalid data sampled from a signed integer texture view [");
        std::operator<<((ostream *)local_4b8,pcVar11);
        std::operator<<((ostream *)local_4b8,"] created from a texture object[");
        std::operator<<((ostream *)local_4b8,pcVar10);
        std::operator<<((ostream *)local_4b8,"] at texel (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,"): expected:(");
        std::ostream::operator<<(local_4b8,reference_components_int[0]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,reference_components_int[1]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,reference_components_int[2]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,reference_components_int[3]);
        std::operator<<((ostream *)local_4b8,") found:(");
        std::ostream::operator<<(local_4b8,view_components_int[0]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_int[1]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_int[2]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_int[3]);
        std::operator<<((ostream *)local_4b8,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&mipmap_data_sstream,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
LAB_00ab48e7:
        _mipmap_data_sstream =
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_4b8);
        std::operator<<((ostream *)local_4b8,"Invalid data sampled from a texture view [");
        std::operator<<((ostream *)local_4b8,pcVar11);
        std::operator<<((ostream *)local_4b8,"] created from a texture object[");
        std::operator<<((ostream *)local_4b8,pcVar10);
        std::operator<<((ostream *)local_4b8,"] at texel (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::operator<<((ostream *)local_4b8,"): expected:(");
        std::ostream::operator<<(local_4b8,(float)local_338._0_4_);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,(float)local_338._4_4_);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,(float)FStack_330.m_value);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,fStack_32c);
        std::operator<<((ostream *)local_4b8,") found:(");
        std::ostream::operator<<(local_4b8,view_components_float[0]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_float[1]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_float[2]);
        std::operator<<((ostream *)local_4b8,", ");
        std::ostream::operator<<(local_4b8,view_components_float[3]);
        std::operator<<((ostream *)local_4b8,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&mipmap_data_sstream,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream(local_4b8);
LAB_00ab4c73:
      uVar13 = uVar13 + 1;
      puVar24 = puVar24 + (long)this_02;
    }
    if (bVar3) {
      _mipmap_data_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream(local_4b8);
      std::operator<<((ostream *)local_4b8,"Invalid data read from a view of internalformat ");
      std::operator<<((ostream *)local_4b8,"[");
      std::operator<<((ostream *)local_4b8,pcVar11);
      std::operator<<((ostream *)local_4b8,"]");
      std::operator<<((ostream *)local_4b8," created from a texture of internalformat ");
      std::operator<<((ostream *)local_4b8,"[");
      std::operator<<((ostream *)local_4b8,pcVar10);
      std::operator<<((ostream *)local_4b8,"]");
      std::operator<<((ostream *)local_4b8,". Byte streams follow:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&mipmap_data_sstream,(EndMessageToken *)&tcu::TestLog::EndMessage
                );
      std::__cxx11::ostringstream::~ostringstream(local_4b8);
      std::__cxx11::stringstream::stringstream((stringstream *)&mipmap_data_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)view_component_sizes);
      pqVar2 = _mipmap_data_sstream[-3].m_log;
      std::ios::fill();
      (&local_4b0.field_0xd0)[(long)pqVar2] = 0x30;
      lVar12 = *(long *)(view_component_sizes._0_8_ + -0x18);
      std::ios::fill();
      (&local_1a8.field_0xd0)[lVar12] = 0x30;
      *(undefined8 *)
       ((long)&(_mipmap_data_sstream[-3].m_log)->flags + (long)&local_4b0._vptr_basic_ostream) = 2;
      *(undefined8 *)
       ((long)&local_1a8._vptr_basic_ostream + *(long *)(view_component_sizes._0_8_ + -0x18)) = 2;
      std::operator<<(&local_4b0,"Mip-map data: [");
      std::operator<<(&local_1a8,"Sampled view data: [");
      for (uVar22 = 0; uVar22 < this->m_view_data_offset; uVar22 = uVar22 + 1) {
        poVar16 = std::operator<<(&local_4b0,"0x");
        *(uint *)(&poVar16->field_0x18 + (long)poVar16->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar16->field_0x18 + (long)poVar16->_vptr_basic_ostream[-3]) & 0xffffffb5 |
             8;
        std::ostream::operator<<(poVar16,(uint)puVar14[uVar22]);
        poVar16 = std::operator<<(&local_1a8,"0x");
        *(uint *)(&poVar16->field_0x18 + (long)poVar16->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar16->field_0x18 + (long)poVar16->_vptr_basic_ostream[-3]) & 0xffffffb5 |
             8;
        std::ostream::operator<<(poVar16,(uint)view_data_ptr[uVar22]);
        if (uVar22 == this->m_view_data_offset - 1) {
          std::operator<<(&local_4b0,"]");
          pcVar10 = "]";
        }
        else {
          std::operator<<(&local_4b0,"|");
          pcVar10 = "|";
        }
        std::operator<<(&local_1a8,pcVar10);
      }
      std::operator<<(&local_1a8,"\n");
      std::operator<<(&local_4b0,"\n");
      this_00 = (ostringstream *)(local_338 + 8);
      local_338 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)this_00,(string *)reference_components_int);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)this_00,(string *)reference_components_uint);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)reference_components_uint);
      std::__cxx11::string::~string((string *)reference_components_int);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this->m_has_test_failed = true;
      std::__cxx11::stringstream::~stringstream((stringstream *)view_component_sizes);
      std::__cxx11::stringstream::~stringstream((stringstream *)&mipmap_data_sstream);
      return;
    }
  }
  _mipmap_data_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_4b8);
  std::operator<<((ostream *)local_4b8,"Correct data read from a view of internalformat ");
  std::operator<<((ostream *)local_4b8,"[");
  std::operator<<((ostream *)local_4b8,pcVar11);
  std::operator<<((ostream *)local_4b8,"]");
  std::operator<<((ostream *)local_4b8," created from a texture of internalformat ");
  std::operator<<((ostream *)local_4b8,"[");
  std::operator<<((ostream *)local_4b8,pcVar10);
  std::operator<<((ostream *)local_4b8,"]");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&mipmap_data_sstream,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_4b8);
  return;
}

Assistant:

void TextureViewTestViewClasses::verifyResultData(glw::GLenum texture_internalformat, glw::GLenum view_internalformat,
												  const unsigned char* texture_data_ptr,
												  const unsigned char* view_data_ptr)
{
	const char* texture_internalformat_string = TextureViewUtilities::getInternalformatString(texture_internalformat);
	const char* view_internalformat_string	= TextureViewUtilities::getInternalformatString(view_internalformat);

	/* For quite a number of cases, we can do a plain memcmp() applied to sampled texture/view data.
	 * If both buffers are a match, we're OK.
	 */
	bool				 has_failed  = false;
	const unsigned char* mipmap_data = DE_NULL;

	if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0)
	{
		/* Iterate over all texel components.
		 *
		 * The approach we're taking here works as follows:
		 *
		 * 1) Calculate what values should be sampled for each component using input mipmap
		 *    data.
		 * 2) Compare the reference values against the values returned when sampling the view.
		 *
		 * Note that in step 2) we're dealing with data that is returned by float/int/uint samplers,
		 * so we need to additionally process the data that we obtain by "casting" input data to
		 * the view's internalformat before we can perform the comparison.
		 *
		 * Finally, if the reference values are calculated for compressed data, we decompress it
		 * to GL_R8/GL_RG8/GL_RGB8/GL_RGBA8 internalformat first, depending on how many components
		 * the compressed internalformat supports.
		 **/
		bool				  can_continue = true;
		const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();

		/* Determine a few important properties first */
		const bool is_view_internalformat_compressed =
			TextureViewUtilities::isInternalformatCompressed(view_internalformat);
		unsigned int n_bits_per_view_texel = 0;

		const unsigned int n_view_components =
			TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
		_format texture_format = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);

		unsigned int view_component_sizes[4] = { 0 };
		_format		 view_format			 = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);

		if (!is_view_internalformat_compressed)
		{
			TextureViewUtilities::getComponentSizeForInternalformat(view_internalformat, view_component_sizes);

			n_bits_per_view_texel =
				view_component_sizes[0] + view_component_sizes[1] + view_component_sizes[2] + view_component_sizes[3];
		}
		else
		{
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				/* Each component of decompressed data will be retrieved as a 32-bit FP */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 32 /* bits per byte */;
				}

				n_bits_per_view_texel = 32 /* bits per byte */ * n_view_components;
			}
			else
			{
				/* Each component of decompressed data is stored as either signed or unsigned
				 * byte. */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 8 /* bits per byte */;
				}

				n_bits_per_view_texel = 8 /* bits per byte */ * n_view_components;
			}
		}

		/* If we need to use compressed data as reference, we need to ask GL to decompress
		 * the mipmap data using view-specific internalformat.
		 */
		mipmap_data = m_mipmap_data;

		if (is_view_internalformat_compressed)
		{
			/* Deallocate the buffer if necessary just in case */
			if (m_decompressed_mipmap_data != DE_NULL)
			{
				delete[] m_decompressed_mipmap_data;

				m_decompressed_mipmap_data = DE_NULL;
			}

			m_decompressed_mipmap_data =
				new unsigned char[m_texture_width * m_texture_height * (n_bits_per_view_texel >> 3)];

			glw::GLuint reference_tex_id = m_to_id;
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				// Encodings of SIGNED and UNSIGNED BPTC compressed texture are not compatible
				// even though they are in the same view class. Since the "view" texture contains
				// the correct encoding for the results we use that as a reference instead of the
				// incompatible parent encoded.
				reference_tex_id = m_view_to_id;
			}
			gl.bindTexture(GL_TEXTURE_2D, reference_tex_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						   (n_view_components == 4) ?
							   GL_RGBA :
							   (n_view_components == 3) ? GL_RGB : (n_view_components == 2) ? GL_RG : GL_RED,
						   (texture_format == FORMAT_SNORM) ?
							   GL_BYTE :
							   (texture_format == FORMAT_FLOAT) ? GL_FLOAT : GL_UNSIGNED_BYTE,
						   m_decompressed_mipmap_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			mipmap_data = m_decompressed_mipmap_data;
		}

		for (unsigned int n_texel = 0; n_texel < m_texture_height * m_texture_width && can_continue; ++n_texel)
		{
			/* NOTE: Vertex shader stores the sampled contents of a view texture as a
			 *       vec4/ivec4/uvec4. This means that each comonent in view_data_ptr
			 *       always takes sizeof(float) = sizeof(int) = sizeof(uint) bytes.
			 *
			 * NOTE: We cast input mip-map's data to view's internalformat, which is
			 *       why we're assuming each components takes n_bits_per_view_texel
			 *       bits instead of n_bits_per_mipmap_texel.
			 */
			const unsigned char* mipmap_texel_data =
				mipmap_data + (n_bits_per_view_texel >> 3 /* 8 bits/byte */) * n_texel;
			float		  reference_components_float[4] = { 0 };
			signed int	reference_components_int[4]   = { 0 };
			unsigned int  reference_components_uint[4]  = { 0 };
			float		  view_components_float[4]		= { 0 };
			signed int	view_components_int[4]		= { 0 };
			unsigned int  view_components_uint[4]		= { 0 };
			_sampler_type view_sampler_type =
				TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
			const unsigned char* view_texel_data = view_data_ptr + sizeof(float) * n_view_components * n_texel;

			/* Retrieve data sampled from the view */
			for (unsigned int n_component = 0; n_component < n_view_components;
				 view_texel_data += sizeof(float), /* as per comment */
				 ++n_component)
			{
				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					view_components_float[n_component] = *((float*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					view_components_int[n_component] = *((signed int*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					view_components_uint[n_component] = *((unsigned int*)view_texel_data);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized sampler type");
				}
				} /* switch (view_sampler_type) */
			}	 /* for (all components) */

			/* Compute reference data. Handle non-byte aligned internalformats manually. */
			if (view_internalformat == GL_R11F_G11F_B10F)
			{
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  red_component   = (*reference_data) & ((1 << 11) - 1);
				const unsigned int  green_component = (*reference_data >> 11) & ((1 << 11) - 1);
				const unsigned int  blue_component  = (*reference_data >> 22) & ((1 << 10) - 1);

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = Float11(red_component).asFloat();
					reference_components_float[1] = Float11(green_component).asFloat();
					reference_components_float[2] = Float10(blue_component).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB9_E5)
			{
				/* Refactored version of tcuTexture.cpp::unpackRGB999E5() */
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  exponent		= (*reference_data >> 27) & ((1 << 5) - 1);
				const unsigned int  red_component   = (*reference_data) & ((1 << 9) - 1);
				const unsigned int  green_component = (*reference_data >> 9) & ((1 << 9) - 1);
				const unsigned int  blue_component  = (*reference_data >> 18) & ((1 << 9) - 1);

				float shared_exponent =
					deFloatPow(2.0f, (float)((int)exponent - 15 /* exponent bias */ - 9 /* mantissa */));

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(red_component) * shared_exponent;
					reference_components_float[1] = float(green_component) * shared_exponent;
					reference_components_float[2] = float(blue_component) * shared_exponent;
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(((*reference_data)) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[1] = float(((*reference_data) >> 10) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[2] = float(((*reference_data) >> 20) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[3] = float(((*reference_data) >> 30) & (mask_a)) / float(mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2UI)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_UNSIGNED_INTEGER)
				{
					reference_components_uint[0] = ((*reference_data)) & (mask_rgb);
					reference_components_uint[1] = ((*reference_data) >> 10) & (mask_rgb);
					reference_components_uint[2] = ((*reference_data) >> 20) & (mask_rgb);
					reference_components_uint[3] = ((*reference_data) >> 30) & (mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RG16F)
			{
				unsigned short* reference_data = (unsigned short*)mipmap_texel_data;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = tcu::Float16(*(reference_data + 0)).asFloat();
					reference_components_float[1] = tcu::Float16(*(reference_data + 1)).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else
			{
				void* result_data = NULL;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
					result_data = reference_components_float;
					break;
				case SAMPLER_TYPE_SIGNED_INTEGER:
					result_data = reference_components_int;
					break;
				case SAMPLER_TYPE_UNSIGNED_INTEGER:
					result_data = reference_components_uint;
					break;

				default:
					TCU_FAIL("Unrecognized sampler type");
				}

				getComponentDataForByteAlignedInternalformat(mipmap_texel_data, n_view_components, view_component_sizes,
															 view_format, result_data);
			}

			for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
			{
				/* If view texture operates on sRGB color space, we need to adjust our
				 * reference value so that it is moved back into linear space.
				 */
				if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) &&
					!TextureViewUtilities::isInternalformatSRGB(texture_internalformat))
				{
					DE_ASSERT(view_sampler_type == SAMPLER_TYPE_FLOAT);

					/* Convert as per (8.14) from GL4.4 spec. Exclude alpha channel. */
					if (n_component != 3)
					{
						if (reference_components_float[n_component] <= 0.04045f)
						{
							reference_components_float[n_component] /= 12.92f;
						}
						else
						{
							reference_components_float[n_component] =
								deFloatPow((reference_components_float[n_component] + 0.055f) / 1.055f, 2.4f);
						}
					} /* if (n_component != 3) */
				}	 /* if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) ) */

				/* Compare the reference and view texture values */
				const float		   epsilon_float = 1.0f / float((1 << (view_component_sizes[n_component] - 1)) - 1);
				const signed int   epsilon_int   = 1;
				const unsigned int epsilon_uint  = 1;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					if (de::abs(reference_components_float[n_component] - view_components_float[n_component]) >
						epsilon_float)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					signed int larger_value  = 0;
					signed int smaller_value = 0;

					if (reference_components_int[n_component] > view_components_int[n_component])
					{
						larger_value  = reference_components_int[n_component];
						smaller_value = view_components_int[n_component];
					}
					else
					{
						smaller_value = reference_components_int[n_component];
						larger_value  = view_components_int[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_int)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					unsigned int larger_value  = 0;
					unsigned int smaller_value = 0;

					if (reference_components_uint[n_component] > view_components_uint[n_component])
					{
						larger_value  = reference_components_uint[n_component];
						smaller_value = view_components_uint[n_component];
					}
					else
					{
						smaller_value = reference_components_uint[n_component];
						larger_value  = view_components_uint[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_uint)
					{
						has_failed = true;
					}

					break;
				}

				default:
					TCU_FAIL("Unrecognized sampler type");
				} /* switch (view_sampler_type) */

				if (has_failed)
				{
					can_continue = false;

					switch (view_sampler_type)
					{
					case SAMPLER_TYPE_FLOAT:
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data sampled from a texture view "
																	   "["
										   << view_internalformat_string << "]"
																			" created from a texture object"
																			"["
										   << texture_internalformat_string << "]"
																			   " at texel "
																			   "("
										   << (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height)
										   << "): expected:(" << reference_components_float[0] << ", "
										   << reference_components_float[1] << ", " << reference_components_float[2]
										   << ", " << reference_components_float[3] << ") found:("
										   << view_components_float[0] << ", " << view_components_float[1] << ", "
										   << view_components_float[2] << ", " << view_components_float[3] << ")."
										   << tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_SIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from a signed integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_int[0] << ", " << reference_components_int[1] << ", "
							<< reference_components_int[2] << ", " << reference_components_int[3] << ") found:("
							<< view_components_int[0] << ", " << view_components_int[1] << ", "
							<< view_components_int[2] << ", " << view_components_int[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_UNSIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from an unsigned integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_uint[0] << ", " << reference_components_uint[1] << ", "
							<< reference_components_uint[2] << ", " << reference_components_uint[3] << ") found:("
							<< view_components_uint[0] << ", " << view_components_uint[1] << ", "
							<< view_components_uint[2] << ", " << view_components_uint[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					default:
						TCU_FAIL("Unrecognized sampler type");
					} /* switch (view_sampler_type) */

					break;
				} /* if (has_failed) */
			}	 /* for (all components) */
		}		  /* for (all texels) */
	}			  /* if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0) */

	if (has_failed)
	{
		/* Log detailed information about the failure */
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]"
						   << ". Byte streams follow:" << tcu::TestLog::EndMessage;

		/* Form texture and view data strings */
		std::stringstream mipmap_data_sstream;
		std::stringstream sampled_view_data_sstream;

		mipmap_data_sstream.fill('0');
		sampled_view_data_sstream.fill('0');

		mipmap_data_sstream.width(2);
		sampled_view_data_sstream.width(2);

		mipmap_data_sstream << "Mip-map data: [";
		sampled_view_data_sstream << "Sampled view data: [";

		for (unsigned int n = 0; n < m_view_data_offset; ++n)
		{
			mipmap_data_sstream << "0x" << std::hex << (int)(mipmap_data[n]);
			sampled_view_data_sstream << "0x" << std::hex << (int)(view_data_ptr[n]);

			if (n != (m_view_data_offset - 1))
			{
				mipmap_data_sstream << "|";
				sampled_view_data_sstream << "|";
			}
			else
			{
				mipmap_data_sstream << "]";
				sampled_view_data_sstream << "]";
			}
		}

		sampled_view_data_sstream << "\n";
		mipmap_data_sstream << "\n";

		/* Log both strings */
		m_testCtx.getLog() << tcu::TestLog::Message << mipmap_data_sstream.str() << sampled_view_data_sstream.str()
						   << tcu::TestLog::EndMessage;

		/* Do not fail the test at this point. Instead, raise a failure flag that will
		 * cause the test to fail once all iterations execute */
		m_has_test_failed = true;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Correct data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]" << tcu::TestLog::EndMessage;
	}
}